

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  UntypedMapBase *pUVar1;
  size_t sVar2;
  size_t sVar3;
  MutexLock local_28;
  MutexLock lock;
  ReflectionPayload *p;
  size_t size;
  MapFieldBase *this_local;
  
  ConstAccess(this);
  lock.mu_ = (Mutex *)maybe_payload(this);
  if ((ReflectionPayload *)lock.mu_ == (ReflectionPayload *)0x0) {
    pUVar1 = MapFieldBaseForParse::GetMapRaw(&this->super_MapFieldBaseForParse);
    p = (ReflectionPayload *)UntypedMapBase::SpaceUsedExcludingSelfLong(pUVar1);
    ConstAccess(this);
  }
  else {
    absl::lts_20250127::MutexLock::MutexLock(&local_28,&((ReflectionPayload *)lock.mu_)->mutex);
    pUVar1 = MapFieldBaseForParse::GetMapRaw(&this->super_MapFieldBaseForParse);
    sVar2 = UntypedMapBase::SpaceUsedExcludingSelfLong(pUVar1);
    sVar3 = RepeatedPtrField<google::protobuf::Message>::SpaceUsedExcludingSelfLong
                      ((RepeatedPtrField<google::protobuf::Message> *)lock.mu_);
    p = (ReflectionPayload *)(sVar2 + sVar3);
    ConstAccess(this);
    absl::lts_20250127::MutexLock::~MutexLock(&local_28);
  }
  return (size_t)p;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  ConstAccess();
  size_t size = 0;
  if (auto* p = maybe_payload()) {
    absl::MutexLock lock(&p->mutex);
    // Measure the map under the lock, because there could be some repeated
    // field data that might be sync'd back into the map.
    size = GetMapRaw().SpaceUsedExcludingSelfLong();
    size += p->repeated_field.SpaceUsedExcludingSelfLong();
    ConstAccess();
  } else {
    // Only measure the map without the repeated field, because it is not there.
    size = GetMapRaw().SpaceUsedExcludingSelfLong();
    ConstAccess();
  }
  return size;
}